

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Interrogator.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::IFF_Layer3Interrogator::IFF_Layer3Interrogator
          (IFF_Layer3Interrogator *this,SimulationIdentifier *ReportingSimulation,
          Mode5InterrogatorBasicData *Data,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
          *Records)

{
  KUINT16 KVar1;
  
  IFF_Layer3::IFF_Layer3(&this->super_IFF_Layer3);
  (this->super_IFF_Layer3).super_LayerHeader.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__IFF_Layer3Interrogator_002189d0;
  Mode5InterrogatorBasicData::Mode5InterrogatorBasicData(&this->m_BasicData);
  KVar1 = ReportingSimulation->m_ui16ApplicationID;
  (this->super_IFF_Layer3).m_RptSim.m_ui16SiteID = ReportingSimulation->m_ui16SiteID;
  (this->super_IFF_Layer3).m_RptSim.m_ui16ApplicationID = KVar1;
  Mode5InterrogatorBasicData::operator=(&this->m_BasicData,Data);
  IFF_Layer3::SetDataRecords(&this->super_IFF_Layer3,Records);
  return;
}

Assistant:

IFF_Layer3Interrogator::IFF_Layer3Interrogator( const SimulationIdentifier & ReportingSimulation, const Mode5InterrogatorBasicData & Data,
                                              std::vector<StdVarPtr> & Records ) 
{
	m_RptSim = ReportingSimulation;
	m_BasicData = Data;
	SetDataRecords( Records );
}